

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O1

void __thiscall Encode::calcProbabilities(Encode *this)

{
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  iterator __position;
  long lVar4;
  int iVar5;
  vector<char,_std::allocator<char>_> *__range1;
  char *pcVar6;
  char *i;
  pointer pcVar7;
  undefined1 auVar8 [16];
  vector<char,_std::allocator<char>_> tmp;
  vector<char,_std::allocator<char>_> local_48;
  double local_28;
  
  pcVar1 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar7 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar1 != pcVar7) {
    lVar4 = 0x3f;
    if ((long)pcVar7 - (long)pcVar1 != 0) {
      for (; (ulong)((long)pcVar7 - (long)pcVar1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pcVar1,pcVar7,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pcVar1,pcVar7);
  }
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar1 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar7 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar1 != pcVar7) {
    std::
    __unique_copy<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
              (pcVar1,pcVar7,&local_48);
  }
  pcVar1 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pcVar7 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pcVar2 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pcVar2 == pcVar3) {
        local_28 = 0.0;
      }
      else {
        iVar5 = 0;
        pcVar6 = pcVar2;
        do {
          iVar5 = iVar5 + (uint)(*pcVar6 == *pcVar7);
          pcVar6 = pcVar6 + 1;
        } while (pcVar6 != pcVar3);
        local_28 = (double)iVar5;
      }
      lVar4 = (long)pcVar3 - (long)pcVar2;
      auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = 0x45300000;
      local_28 = local_28 /
                 ((auVar8._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
      __position._M_current =
           (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->m_probabilities,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar1);
  }
  std::vector<char,_std::allocator<char>_>::operator=(&this->m_data,&local_48);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void calcProbabilities() {
        sort(m_data.begin(), m_data.end());
        vector<char> tmp;
        unique_copy(m_data.begin(), m_data.end(), back_inserter(tmp));
        for (auto &i : tmp) {
            int countElements = count(m_data.begin(), m_data.end(), i);
            m_probabilities.push_back((double) countElements / m_data.size());
        }
        m_data = tmp;
    }